

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_TimedText.cpp
# Opt level: O0

h__Reader * __thiscall
ASDCP::TimedText::MXFReader::h__Reader::ReadTimedTextResource
          (h__Reader *this,FrameBuffer *FrameBuf,AESDecContext *Ctx,HMACContext *HMAC)

{
  AESDecContext *pAVar1;
  int iVar2;
  ulong uVar3;
  AESDecContext *Ctx_00;
  allocator<char> local_69;
  string local_68;
  undefined1 local_31;
  HMACContext *HMAC_local;
  AESDecContext *Ctx_local;
  FrameBuffer *FrameBuf_local;
  h__Reader *this_local;
  Result_t *result;
  
  HMAC_local = HMAC;
  Ctx_local = Ctx;
  FrameBuf_local = FrameBuf;
  this_local = this;
  uVar3 = (**(code **)(**(long **)&(FrameBuf->super_FrameBuffer).m_Capacity + 0x40))();
  pAVar1 = Ctx_local;
  if ((uVar3 & 1) == 0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_INIT);
  }
  else {
    if ((FrameBuf->super_FrameBuffer).m_Data == (byte_t *)0x0) {
      __assert_fail("m_Dict",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_TimedText.cpp"
                    ,0xf0,
                    "ASDCP::Result_t ASDCP::TimedText::MXFReader::h__Reader::ReadTimedTextResource(FrameBuffer &, AESDecContext *, HMACContext *)"
                   );
    }
    local_31 = 0;
    Ctx_00 = (AESDecContext *)
             Dictionary::ul((Dictionary *)(FrameBuf->super_FrameBuffer).m_Data,MDD_TimedTextEssence)
    ;
    h__ASDCPReader::ReadEKLVFrame
              (&this->super_h__ASDCPReader,(ui32_t)FrameBuf,(FrameBuffer *)0x0,(byte_t *)pAVar1,
               Ctx_00,HMAC_local);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar2) {
      FrameBuffer::AssetID((FrameBuffer *)Ctx_local,&FrameBuf[0x13].super_FrameBuffer.m_OwnMem);
      pAVar1 = Ctx_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"text/xml",&local_69);
      FrameBuffer::MIMEType((FrameBuffer *)pAVar1,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator(&local_69);
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::TimedText::MXFReader::h__Reader::ReadTimedTextResource(FrameBuffer& FrameBuf,
							      AESDecContext* Ctx, HMACContext* HMAC)
{
  if ( ! m_File->IsOpen() )
    return RESULT_INIT;

  assert(m_Dict);
  Result_t result = ReadEKLVFrame(0, FrameBuf, m_Dict->ul(MDD_TimedTextEssence), Ctx, HMAC);

 if( ASDCP_SUCCESS(result) )
   {
     FrameBuf.AssetID(m_TDesc.AssetID);
     FrameBuf.MIMEType("text/xml");
   }

 return result;
}